

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O2

bool __thiscall TestClass::SyncRetFunc3(TestClass *this,uint64_t *p1,uint32_t p2,uint16_t *p3)

{
  char cVar1;
  SyncRetEventAgent<bool> *this_00;
  ssize_t sVar2;
  void *__buf;
  int in_R8D;
  
  cVar1 = EventDispatcher::isThreadCurrent();
  if (cVar1 != '\0') {
    *p1 = *p1 + 0x400;
    *p3 = *p3 + 0x100;
    return true;
  }
  this_00 = (SyncRetEventAgent<bool> *)
            operator_new(0x48,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0x11d);
  *(undefined8 *)&this_00->field_0x8 = 0xfffffffb00000000;
  *(undefined4 *)&this_00->field_0x10 = 0;
  *(undefined ***)this_00 = &PTR_onRefCountZero_00110b08;
  *(TestClass **)(this_00 + 1) = this;
  *(code **)&this_00[1].field_0x8 = SyncRetFunc3;
  *(undefined8 *)&this_00[1].field_0x10 = 0;
  *(uint64_t **)(this_00 + 2) = p1;
  *(uint32_t *)&this_00[2].field_0x8 = p2;
  *(uint16_t **)&this_00[2].field_0x10 = p3;
  sVar2 = SyncRetEventAgent<bool>::send(this_00,(int)this + 8,__buf,0x10a696,in_R8D);
  return SUB81(sVar2,0);
}

Assistant:

bool SyncRetFunc3(uint64_t& p1, uint32_t p2, uint16_t& p3)
	{
		if (not mEventThread.isThreadCurrent())
		{
			bool result = false;
			SyncRetEventAgent3<TestClass, bool, uint64_t &, uint32_t, uint16_t &>* agent =
				jh_new SyncRetEventAgent3<TestClass, bool, uint64_t &, uint32_t, uint16_t &>(this, &TestClass::SyncRetFunc3,
					p1, p2, p3);
			result = agent->send(&mEventThread);
			LOG_INFO("RetVal(%d) p1(%llu) p2(%u) p3(%u)", result, p1, p2, p3);
			return result;
		}
		
		LOG_INFO("Received p1(%llu) p2(%u) p3(%u)", p1, p2, p3);
		p1+=1024;
		p2+=512;
		p3+=256;
		return true;
	}